

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O2

void __thiscall wasm::ExtractFunction::run(ExtractFunction *this,Module *module)

{
  char *in_R8;
  Name name_00;
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  Name name;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"extract-function",
             (allocator<char> *)((long)&name.super_IString.str._M_str + 6));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ExtractFunction usage:  wasm-opt --extract-function=FUNCTION_NAME"
             ,(allocator<char> *)((long)&name.super_IString.str._M_str + 7));
  Pass::getArgument(&local_90,&this->super_Pass,&local_70,&local_50);
  IString::IString((IString *)local_30,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  name_00.super_IString.str._M_str = in_R8;
  name_00.super_IString.str._M_len = name.super_IString.str._M_len;
  wasm::extract((wasm *)(this->super_Pass).runner,(PassRunner *)module,(Module *)local_30,name_00);
  return;
}

Assistant:

void run(Module* module) override {
    Name name = getArgument(
      "extract-function",
      "ExtractFunction usage:  wasm-opt --extract-function=FUNCTION_NAME");
    extract(getPassRunner(), module, name);
  }